

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  char *pcVar1;
  size_type __new_size;
  reference out;
  undefined4 local_2c;
  long size;
  string *filename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (filename);
  __new_size = lodepng_filesize(pcVar1);
  if ((long)__new_size < 0) {
    buffer_local._4_4_ = 0x4e;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,__new_size);
    if (__new_size == 0) {
      local_2c = 0;
    }
    else {
      out = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](buffer,0);
      pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(filename);
      local_2c = lodepng_buffer_file(out,__new_size,pcVar1);
    }
    buffer_local._4_4_ = local_2c;
  }
  return buffer_local._4_4_;
}

Assistant:

unsigned load_file(std::vector<unsigned char>& buffer, const std::string& filename) {
  long size = lodepng_filesize(filename.c_str());
  if(size < 0) return 78;
  buffer.resize((size_t)size);
  return size == 0 ? 0 : lodepng_buffer_file(&buffer[0], (size_t)size, filename.c_str());
}